

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

size_t __thiscall
tonk::OutgoingQueue::AppendSplitReliable
          (OutgoingQueue *this,uint messageType,uint8_t *messageData,size_t messageBytes)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  OutgoingQueuedDatagram *pOVar4;
  ushort uVar5;
  int iVar6;
  
  pOVar4 = this->OutBuffer;
  if (pOVar4 != (OutgoingQueuedDatagram *)0x0) {
    uVar2 = pOVar4->NextWriteOffset;
    uVar3 = this->Common->MaxMessageSectionBytes;
    if (uVar2 + 0x16 <= uVar3) {
      uVar5 = (short)messageType * 0x800;
      iVar6 = (int)messageBytes + 2;
      uVar1 = uVar5 + 0x3000;
      if (uVar3 < uVar2 + 2 + (int)messageBytes) {
        messageBytes = (ulong)((uVar3 - uVar2) - 2);
        iVar6 = uVar3 - uVar2;
        uVar1 = uVar5;
      }
      *(ushort *)(pOVar4->Data + (ulong)uVar2 + 2 + -2) = uVar1 | (ushort)messageBytes;
      memcpy(pOVar4->Data + (ulong)uVar2 + 2,messageData,messageBytes);
      pOVar4->NextWriteOffset = iVar6 + uVar2;
      this->QueuedBytes = this->QueuedBytes + iVar6;
      return messageBytes;
    }
  }
  return 0;
}

Assistant:

size_t OutgoingQueue::AppendSplitReliable(
    unsigned messageType,
    const uint8_t* messageData,
    size_t messageBytes)
{
    TONK_VERBOSE_OUTGOING_LOG("OutgoingQueue::AppendSplitReliable messageType=", messageType,
        " messageBytes=", messageBytes, " OutBuffer=", OutBuffer);

    OutgoingQueuedDatagram* datagram = OutBuffer;
    if (!datagram)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: OutBuffer is null - abort");
        return 0;
    }

    const unsigned nextWriteOffset = datagram->NextWriteOffset;
    const unsigned bufferBytes = Common->MaxMessageSectionBytes;

    // If there is not enough room left in the datagram then return false
    if (nextWriteOffset + protocol::kMessageFrameBytes + protocol::kMessageSplitMinimumBytes > bufferBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: nextWriteOffset=", nextWriteOffset,
            " + overhead=", (protocol::kMessageFrameBytes + protocol::kMessageSplitMinimumBytes),
            " > bufferBytes=", bufferBytes);
        return 0;
    }

    unsigned writeBytes = static_cast<unsigned>(protocol::kMessageFrameBytes + messageBytes);

    // If there are more bytes to write than space available:
    if (nextWriteOffset + writeBytes > bufferBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: nextWriteOffset=", nextWriteOffset,
            " + writeBytes=", writeBytes, " > bufferBytes=", bufferBytes);

        TONK_DEBUG_ASSERT(bufferBytes >= nextWriteOffset);
        writeBytes = bufferBytes - nextWriteOffset;

        TONK_DEBUG_ASSERT(writeBytes >= protocol::kMessageFrameBytes);
        messageBytes = static_cast<size_t>(writeBytes - protocol::kMessageFrameBytes);

        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: Now writeBytes=", writeBytes,
            " messageBytes=", messageBytes);
    }
    else
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: FINAL MESSAGE");

        messageType += TonkChannel_Count; // Mark as final message
    }

    uint8_t* messagePtr = datagram->Data + nextWriteOffset;

    // Write 2-byte message frame header
    protocol::WriteMessageFrameHeader(
        messagePtr,
        messageType,
        static_cast<unsigned>(messageBytes));

    // Copy message into place
    memcpy(messagePtr + protocol::kMessageFrameBytes, messageData, messageBytes);

    TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_Reliable);

    // Record that the data was written
    datagram->NextWriteOffset = nextWriteOffset + writeBytes;

    // Update queued bytes
    QueuedBytes += writeBytes;

    TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: WROTE TO DATAGRAM datagram->NextWriteOffset=",
        datagram->NextWriteOffset, " + writeBytes=", writeBytes, " MaxMessageSectionBytes=",
        Common->MaxMessageSectionBytes, " QueuedBytes=", QueuedBytes);

#ifdef TONK_DETAILED_STATS
    datagram->AddMessageStats(messageType, static_cast<unsigned>(messageBytes));
#endif // TONK_DETAILED_STATS

    return messageBytes;
}